

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O2

char * __thiscall google::protobuf::Field::_InternalParse(Field *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  void *pvVar1;
  bool bVar2;
  uint64 uVar3;
  Option *msg;
  string *s;
  char *field_name;
  UnknownFieldSet *unknown;
  char cVar4;
  ulong tag_00;
  uint local_3c;
  char *pcStack_38;
  uint32 tag;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  pcStack_38 = ptr;
  do {
    bVar2 = internal::ParseContext::Done(ctx,&stack0xffffffffffffffc8);
    if (bVar2) {
      return pcStack_38;
    }
    pcStack_38 = internal::ReadTag(pcStack_38,&local_3c,0);
    if (pcStack_38 == (char *)0x0) {
      return (char *)0x0;
    }
    tag_00 = (ulong)local_3c;
    cVar4 = (char)local_3c;
    switch(local_3c >> 3) {
    case 1:
      if (cVar4 != '\b') break;
      uVar3 = internal::ReadVarint64(&stack0xffffffffffffffc8);
      if (pcStack_38 == (char *)0x0) {
        return (char *)0x0;
      }
      this->kind_ = (int)uVar3;
LAB_0031bb10:
      cVar4 = '\x02';
      goto LAB_0031bbfd;
    case 2:
      if (cVar4 == '\x10') {
        uVar3 = internal::ReadVarint64(&stack0xffffffffffffffc8);
        if (pcStack_38 == (char *)0x0) {
          return (char *)0x0;
        }
        this->cardinality_ = (int)uVar3;
        goto LAB_0031bb10;
      }
      break;
    case 3:
      if (cVar4 == '\x18') {
        uVar3 = internal::ReadVarint64(&stack0xffffffffffffffc8);
        this->number_ = (int32)uVar3;
LAB_0031babb:
        cVar4 = '\x02';
        if (pcStack_38 == (char *)0x0) {
          return (char *)0x0;
        }
        goto LAB_0031bbfd;
      }
      break;
    case 4:
      if (cVar4 == '\"') {
        s = _internal_mutable_name_abi_cxx11_(this);
        pcStack_38 = internal::InlineGreedyStringParser(s,pcStack_38,ctx);
        field_name = "google.protobuf.Field.name";
LAB_0031bbe1:
        bVar2 = internal::VerifyUTF8(s,field_name);
        if (!bVar2) {
          return (char *)0x0;
        }
        cVar4 = (pcStack_38 == (char *)0x0) * '\x02' + '\x02';
        goto LAB_0031bbfd;
      }
      break;
    case 6:
      if (cVar4 == '2') {
        s = _internal_mutable_type_url_abi_cxx11_(this);
        pcStack_38 = internal::InlineGreedyStringParser(s,pcStack_38,ctx);
        field_name = "google.protobuf.Field.type_url";
        goto LAB_0031bbe1;
      }
      break;
    case 7:
      if (cVar4 == '8') {
        uVar3 = internal::ReadVarint64(&stack0xffffffffffffffc8);
        this->oneof_index_ = (int32)uVar3;
        goto LAB_0031babb;
      }
      break;
    case 8:
      if (cVar4 == '@') {
        uVar3 = internal::ReadVarint64(&stack0xffffffffffffffc8);
        this->packed_ = uVar3 != 0;
        goto LAB_0031babb;
      }
      break;
    case 9:
      if (cVar4 == 'J') {
        pcStack_38 = pcStack_38 + -1;
        do {
          pcStack_38 = pcStack_38 + 1;
          msg = RepeatedPtrField<google::protobuf::Option>::Add(&this->options_);
          pcStack_38 = internal::ParseContext::ParseMessage<google::protobuf::Option>
                                 (ctx,msg,pcStack_38);
          if (pcStack_38 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((pcStack_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*pcStack_38 == 'J'));
        goto LAB_0031bb10;
      }
      break;
    case 10:
      if (cVar4 == 'R') {
        s = _internal_mutable_json_name_abi_cxx11_(this);
        pcStack_38 = internal::InlineGreedyStringParser(s,pcStack_38,ctx);
        field_name = "google.protobuf.Field.json_name";
        goto LAB_0031bbe1;
      }
      break;
    case 0xb:
      if (cVar4 == 'Z') {
        s = _internal_mutable_default_value_abi_cxx11_(this);
        pcStack_38 = internal::InlineGreedyStringParser(s,pcStack_38,ctx);
        field_name = "google.protobuf.Field.default_value";
        goto LAB_0031bbe1;
      }
    }
    if ((tag_00 == 0) || ((local_3c & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
      return pcStack_38;
    }
    pvVar1 = this_00->ptr_;
    if (((ulong)pvVar1 & 1) == 0) {
      unknown = internal::InternalMetadata::
                mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
    }
    else {
      unknown = (UnknownFieldSet *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 8);
    }
    pcStack_38 = internal::UnknownFieldParse(tag_00,unknown,pcStack_38,ctx);
    cVar4 = '\x02';
    if (pcStack_38 == (char *)0x0) {
      return (char *)0x0;
    }
LAB_0031bbfd:
    if (cVar4 != '\x02') {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* Field::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // .google.protobuf.Field.Kind kind = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_kind(static_cast<PROTOBUF_NAMESPACE_ID::Field_Kind>(val));
        } else goto handle_unusual;
        continue;
      // .google.protobuf.Field.Cardinality cardinality = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_cardinality(static_cast<PROTOBUF_NAMESPACE_ID::Field_Cardinality>(val));
        } else goto handle_unusual;
        continue;
      // int32 number = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 24)) {
          number_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // string name = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          auto str = _internal_mutable_name();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.Field.name"));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // string type_url = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 50)) {
          auto str = _internal_mutable_type_url();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.Field.type_url"));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // int32 oneof_index = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 56)) {
          oneof_index_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // bool packed = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 64)) {
          packed_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.Option options = 9;
      case 9:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 74)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_options(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<74>(ptr));
        } else goto handle_unusual;
        continue;
      // string json_name = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 82)) {
          auto str = _internal_mutable_json_name();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.Field.json_name"));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // string default_value = 11;
      case 11:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 90)) {
          auto str = _internal_mutable_default_value();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.Field.default_value"));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}